

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____8>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____8> *this)

{
  code *pcVar1;
  EventManager *pEVar2;
  ____C_A_T_C_H____T_E_S_T____8 obj;
  EntityManagerFixture local_c0;
  
  EntityManagerFixture::EntityManagerFixture(&local_c0);
  pcVar1 = (code *)this->m_testAsMethod;
  pEVar2 = &local_c0.ev + *(long *)&this->field_0x10;
  if (((ulong)pcVar1 & 1) != 0) {
    pcVar1 = *(code **)(pcVar1 + *(long *)pEVar2 + -1);
  }
  (*pcVar1)(pEVar2);
  EntityManagerFixture::~EntityManagerFixture(&local_c0);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }